

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  char *beg;
  char __c;
  undefined8 uVar1;
  undefined1 uVar2;
  int iVar3;
  int extraout_var;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar5;
  bool bVar6;
  bool bVar7;
  stream_line_reader line_reader;
  char buf [2048];
  char local_881;
  Stream *local_880;
  undefined1 local_878 [32];
  ulong local_858;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_850;
  anon_class_8_1_b2c1a266 local_840;
  char local_838 [2056];
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_878 + 0x18);
  local_878._0_8_ = local_838;
  local_878._8_8_ = 0x800;
  local_878._24_8_ = &local_850;
  local_878._16_8_ = 0;
  local_858 = 0;
  local_850._M_local_buf[0] = '\0';
  lVar5 = 0;
  local_880 = strm;
  local_840.headers = headers;
  do {
    iVar3 = (*local_880->_vptr_Stream[4])(local_880,&local_881,1);
    uVar1 = local_878._16_8_;
    __c = local_881;
    if (extraout_var < 0) {
      bVar7 = false;
      bVar6 = false;
    }
    else if (CONCAT44(extraout_var,iVar3) == 0) {
      bVar6 = lVar5 != 0;
      bVar7 = false;
    }
    else {
      if ((ulong)local_878._16_8_ < local_878._8_8_ - 1) {
        local_878._16_8_ = local_878._16_8_ + 1;
        *(char *)(local_878._0_8_ + uVar1) = local_881;
        *(char *)(local_878._0_8_ + local_878._16_8_) = '\0';
      }
      else {
        if (local_858 == 0) {
          if (*(char *)(local_878._0_8_ + local_878._16_8_) != '\0') {
            __assert_fail("fixed_buffer_[fixed_buffer_used_size_] == \'\\0\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/thirdparty/cpp-httplib/httplib.h"
                          ,0x920,"void httplib::detail::stream_line_reader::append(char)");
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace(this,0,0,(char *)local_878._0_8_,local_878._16_8_);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this,__c);
      }
      bVar7 = local_881 != '\n';
      bVar6 = true;
    }
    lVar5 = lVar5 + -1;
  } while (bVar7);
  if (bVar6) {
    uVar4 = local_858;
    if (local_858 == 0) {
      uVar4 = local_878._16_8_;
    }
    if (local_858 == 0) {
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_878;
    }
    lVar5 = 3;
    if (1 < uVar4) {
      beg = (this->_M_dataplus)._M_p;
      if ((((beg[uVar4 - 2] == '\r') && (beg[uVar4 - 1] == '\n')) && (lVar5 = 2, uVar4 != 2)) &&
         (lVar5 = 1, uVar4 < 0x2001)) {
        lVar5 = 0;
        parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                  (beg,beg + (uVar4 - 2),local_840);
      }
    }
    uVar2 = (*(code *)((long)&DAT_001724e0 + (long)(int)(&DAT_001724e0)[lVar5]))();
    return (bool)uVar2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_878._24_8_ != &local_850) {
    operator_delete((void *)local_878._24_8_,
                    CONCAT71(local_850._M_allocated_capacity._1_7_,local_850._M_local_buf[0]) + 1);
  }
  return false;
}

Assistant:

inline bool read_headers(Stream &strm, Headers &headers) {
  const auto bufsiz = 2048;
  char buf[bufsiz];
  stream_line_reader line_reader(strm, buf, bufsiz);

  for (;;) {
    if (!line_reader.getline()) { return false; }

    // Check if the line ends with CRLF.
    auto line_terminator_len = 2;
    if (line_reader.end_with_crlf()) {
      // Blank line indicates end of headers.
      if (line_reader.size() == 2) { break; }
#ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
    } else {
      // Blank line indicates end of headers.
      if (line_reader.size() == 1) { break; }
      line_terminator_len = 1;
    }
#else
    } else {
      continue; // Skip invalid line.
    }